

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O0

TestStatus * __thiscall
vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters>::iterate
          (TestStatus *__return_storage_ptr__,
          FunctionInstance1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters> *this)

{
  Context *pCVar1;
  Function p_Var2;
  TestStatus *pTVar3;
  Parameters local_40;
  FunctionInstance1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters> *local_18;
  FunctionInstance1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters> *this_local;
  
  pCVar1 = (this->super_TestInstance).m_context;
  p_Var2 = (this->m_args).func;
  pTVar3 = __return_storage_ptr__;
  local_18 = this;
  this_local = (FunctionInstance1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters> *)
               __return_storage_ptr__;
  api::anon_unknown_1::ShaderModule::Parameters::Parameters(&local_40,&(this->m_args).arg0);
  (*p_Var2)(__return_storage_ptr__,pCVar1,SUB81(pTVar3,0));
  api::anon_unknown_1::ShaderModule::Parameters::~Parameters(&local_40);
  return pTVar3;
}

Assistant:

tcu::TestStatus	iterate				(void) { return m_args.func(m_context, m_args.arg0); }